

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinit.c
# Opt level: O3

void Xevent_before_raid(DspInterface dsp)

{
  XSelectInput(dsp->display_id,dsp->LispWindow,0);
  XSelectInput(dsp->display_id,dsp->DisplayWindow,0);
  if (noscroll == 0) {
    XSelectInput(dsp->display_id,dsp->VerScrollBar,0);
    XSelectInput(dsp->display_id,dsp->HorScrollBar,0);
    XSelectInput(dsp->display_id,dsp->NEGrav,0);
    XSelectInput(dsp->display_id,dsp->SEGrav,0);
    XSelectInput(dsp->display_id,dsp->SWGrav,0);
    XSelectInput(dsp->display_id,dsp->NWGrav,0);
  }
  XFlush(dsp->display_id);
  return;
}

Assistant:

void Xevent_before_raid(DspInterface dsp)
{
  TPRINT(("TRACE: Xevent_before_raid()\n"));

  XSelectInput(dsp->display_id, dsp->LispWindow, NoEventMask);
  XSelectInput(dsp->display_id, dsp->DisplayWindow, NoEventMask);
  if (noscroll == 0) {
    XSelectInput(dsp->display_id, dsp->VerScrollBar, NoEventMask);
    XSelectInput(dsp->display_id, dsp->HorScrollBar, NoEventMask);
    XSelectInput(dsp->display_id, dsp->NEGrav, NoEventMask);
    XSelectInput(dsp->display_id, dsp->SEGrav, NoEventMask);
    XSelectInput(dsp->display_id, dsp->SWGrav, NoEventMask);
    XSelectInput(dsp->display_id, dsp->NWGrav, NoEventMask);
  }
  XLOCK;
  XFlush(dsp->display_id);
  XUNLOCK(dsp);
}